

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O1

void __thiscall Jinx::Impl::FunctionSignature::Write(FunctionSignature *this,BinaryWriter *writer)

{
  size_t *pos;
  pointer pFVar1;
  pointer pbVar2;
  uchar v;
  FunctionSignaturePart *part;
  pointer pFVar3;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *name;
  pointer val;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  char local_39;
  RuntimeID local_38;
  
  local_38 = this->m_id;
  pos = &writer->m_pos;
  Buffer::Write((writer->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr,pos,&local_38,8);
  local_3a = (undefined1)this->m_visibility;
  Buffer::Write((writer->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr,pos,&local_3a,1);
  BinaryWriter::Write(writer,&this->m_libraryName);
  local_39 = (char)((uint)(*(int *)&(this->m_parts).
                                    super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->m_parts).
                                   super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 6) * -0x55;
  Buffer::Write((writer->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr,pos,&local_39,1);
  pFVar1 = (this->m_parts).
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar3 = (this->m_parts).
                super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar3 != pFVar1; pFVar3 = pFVar3 + 1) {
    local_3e = (undefined1)pFVar3->partType;
    Buffer::Write((writer->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,pos,&local_3e,1);
    local_3d = pFVar3->optional;
    Buffer::Write((writer->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,pos,&local_3d,1);
    local_3c = (undefined1)pFVar3->valueType;
    Buffer::Write((writer->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,pos,&local_3c,1);
    local_3b = (undefined1)
               ((uint)(*(int *)&(pFVar3->names).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                      *(int *)&(pFVar3->names).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 5);
    Buffer::Write((writer->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr,pos,&local_3b,1);
    pbVar2 = (pFVar3->names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (val = (pFVar3->names).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
               ._M_impl.super__Vector_impl_data._M_start; val != pbVar2; val = val + 1) {
      BinaryWriter::Write(writer,val);
    }
  }
  return;
}

Assistant:

inline_t void FunctionSignature::Write(BinaryWriter & writer) const
	{
		// Write this object to a memory buffer
		writer.Write(m_id);
		writer.Write<VisibilityType, uint8_t>(m_visibility);
		writer.Write(m_libraryName);
		writer.Write(static_cast<uint8_t>(m_parts.size()));
		for (const auto & part : m_parts)
		{
			writer.Write<FunctionSignaturePartType, uint8_t>(part.partType);
			writer.Write(part.optional);
			writer.Write<ValueType, uint8_t>(part.valueType);
			writer.Write(static_cast<uint8_t>(part.names.size()));
			for (const auto & name : part.names)
			{
				writer.Write(name);
			}
		}
	}